

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

uint __thiscall llvm::APInt::countTrailingZerosSlowCase(APInt *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  uVar1 = this->BitWidth;
  uVar4 = (ulong)uVar1;
  bVar10 = uVar4 != 0;
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    if (*(this->U).pVal == 0) {
      uVar7 = (uint)(uVar4 + 0x3f >> 6);
      uVar6 = uVar7 << 6;
      uVar5 = 0;
      lVar9 = 0;
      do {
        if (uVar7 - 1 == (int)lVar9) goto LAB_0019d2df;
        uVar5 = uVar5 + 0x40;
        lVar8 = lVar9 + 1;
        lVar2 = lVar9 + 1;
        lVar9 = lVar8;
      } while ((this->U).pVal[lVar2] == 0);
      bVar10 = (uint)lVar8 < uVar7;
      uVar6 = uVar5;
    }
    else {
      lVar8 = 0;
      uVar6 = 0;
    }
    if (bVar10) {
      uVar4 = (this->U).pVal[lVar8];
      if (uVar4 == 0) {
        iVar3 = 0x40;
      }
      else {
        lVar9 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        iVar3 = (int)lVar9;
      }
      uVar6 = uVar6 + iVar3;
    }
  }
LAB_0019d2df:
  if (uVar1 < uVar6) {
    uVar6 = uVar1;
  }
  return uVar6;
}

Assistant:

unsigned APInt::countTrailingZerosSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == 0; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingZeros(U.pVal[i]);
  return std::min(Count, BitWidth);
}